

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O1

void __thiscall ACustomSprite::BeginPlay(ACustomSprite *this)

{
  ActorRenderFlags *pAVar1;
  uint uVar2;
  FTextureID FVar3;
  char name [9];
  char local_19 [9];
  
  AActor::BeginPlay(&this->super_AActor);
  mysnprintf(local_19,9,"BTIL%04d");
  FVar3 = FTextureManager::GetTexture(&TexMan,local_19,5,0);
  (this->super_AActor).picnum.texnum = FVar3.texnum;
  (this->super_AActor).Scale.X = (double)(this->super_AActor).args[2] * 0.015625;
  (this->super_AActor).Scale.Y = (double)(this->super_AActor).args[3] * 0.015625;
  uVar2 = (this->super_AActor).args[4];
  if ((uVar2 & 2) != 0) {
    (this->super_AActor).RenderStyle = LegacyRenderStyles[6];
    (this->super_AActor).Alpha = *(double *)(&DAT_0073d0f0 + (ulong)((uVar2 >> 9 & 1) == 0) * 8);
  }
  if ((uVar2 & 4) != 0) {
    pAVar1 = &(this->super_AActor).renderflags;
    *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 1;
  }
  if ((uVar2 & 8) != 0) {
    pAVar1 = &(this->super_AActor).renderflags;
    *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 2;
  }
  pAVar1 = &(this->super_AActor).renderflags;
  pAVar1->Value = pAVar1->Value | (uVar2 & 0x30) << 8;
  return;
}

Assistant:

void ACustomSprite::BeginPlay ()
{
	char name[9];
	Super::BeginPlay ();

	mysnprintf (name, countof(name), "BTIL%04d", args[0] & 0xffff);
	picnum = TexMan.GetTexture (name, FTexture::TEX_Build);

	Scale.X = args[2] / 64.;
	Scale.Y = args[3] / 64.;

	int cstat = args[4];
	if (cstat & 2)
	{
		RenderStyle = STYLE_Translucent;
		Alpha = (cstat & 512) ? 0.6666 : 0.3333;
	}
	if (cstat & 4)
		renderflags |= RF_XFLIP;
	if (cstat & 8)
		renderflags |= RF_YFLIP;

	// set face/wall/floor flags
	renderflags |= ActorRenderFlags::FromInt (((cstat >> 4) & 3) << 12);
}